

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3JoinType(Parse *pParse,Token *pA,Token *pB,Token *pC)

{
  uint N;
  Token *pTVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  Token *apAll [3];
  
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  lVar3 = 0;
  uVar5 = 0;
LAB_0015af89:
  lVar7 = 2;
  if ((lVar3 == 3) || (pTVar1 = apAll[lVar3], pTVar1 == (Token *)0x0)) {
LAB_0015afee:
    if ((((uVar5 & 0x38) == 0x20) || ((uVar5 & 0x21) == 0x21)) || ((uVar5 & 0x80) != 0)) {
      pcVar6 = " ";
      pcVar4 = " ";
      if (pB == (Token *)0x0) {
        pcVar4 = "";
      }
      if (pC == (Token *)0x0) {
        pcVar6 = "";
      }
      sqlite3ErrorMsg(pParse,"unknown join type: %T%s%T%s%T",pA,pcVar4,pB,pcVar6,pC);
      uVar5 = 1;
    }
    return uVar5;
  }
  N = pTVar1->n;
  do {
    if (lVar7 == 0x17) {
      uVar5 = uVar5 | 0x80;
      goto LAB_0015afee;
    }
    if (N == (byte)(&UNK_001a8d7f)[lVar7]) {
      iVar2 = sqlite3_strnicmp(pTVar1->z,
                               "naturaleftouterightfullinnercross" + (byte)(&UNK_001a8d7e)[lVar7],N)
      ;
      if (iVar2 == 0) break;
    }
    lVar7 = lVar7 + 3;
  } while( true );
  uVar5 = uVar5 | (&sqlite3JoinType::aKeyword[0].i)[lVar7];
  lVar3 = lVar3 + 1;
  goto LAB_0015af89;
}

Assistant:

SQLITE_PRIVATE int sqlite3JoinType(Parse *pParse, Token *pA, Token *pB, Token *pC){
  int jointype = 0;
  Token *apAll[3];
  Token *p;
                             /*   0123456789 123456789 123456789 123 */
  static const char zKeyText[] = "naturaleftouterightfullinnercross";
  static const struct {
    u8 i;        /* Beginning of keyword text in zKeyText[] */
    u8 nChar;    /* Length of the keyword in characters */
    u8 code;     /* Join type mask */
  } aKeyword[] = {
    /* (0) natural */ { 0,  7, JT_NATURAL                },
    /* (1) left    */ { 6,  4, JT_LEFT|JT_OUTER          },
    /* (2) outer   */ { 10, 5, JT_OUTER                  },
    /* (3) right   */ { 14, 5, JT_RIGHT|JT_OUTER         },
    /* (4) full    */ { 19, 4, JT_LEFT|JT_RIGHT|JT_OUTER },
    /* (5) inner   */ { 23, 5, JT_INNER                  },
    /* (6) cross   */ { 28, 5, JT_INNER|JT_CROSS         },
  };
  int i, j;
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  for(i=0; i<3 && apAll[i]; i++){
    p = apAll[i];
    for(j=0; j<ArraySize(aKeyword); j++){
      if( p->n==aKeyword[j].nChar
          && sqlite3StrNICmp((char*)p->z, &zKeyText[aKeyword[j].i], p->n)==0 ){
        jointype |= aKeyword[j].code;
        break;
      }
    }
    testcase( j==0 || j==1 || j==2 || j==3 || j==4 || j==5 || j==6 );
    if( j>=ArraySize(aKeyword) ){
      jointype |= JT_ERROR;
      break;
    }
  }
  if(
     (jointype & (JT_INNER|JT_OUTER))==(JT_INNER|JT_OUTER) ||
     (jointype & JT_ERROR)!=0 ||
     (jointype & (JT_OUTER|JT_LEFT|JT_RIGHT))==JT_OUTER
  ){
    const char *zSp1 = " ";
    const char *zSp2 = " ";
    if( pB==0 ){ zSp1++; }
    if( pC==0 ){ zSp2++; }
    sqlite3ErrorMsg(pParse, "unknown join type: "
       "%T%s%T%s%T", pA, zSp1, pB, zSp2, pC);
    jointype = JT_INNER;
  }
  return jointype;
}